

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void std::__insertion_sort<QList<int>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
               (int *__first,int *__last)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  value_type __val;
  long lVar7;
  int *piVar8;
  long lVar9;
  
  if (__first != __last) {
    piVar6 = __first;
    for (piVar5 = __first + 1; piVar5 != __last; piVar5 = piVar5 + 1) {
      iVar3 = *piVar5;
      if (iVar3 < *__first) {
        lVar9 = (long)piVar5 - (long)__first >> 2;
        piVar8 = __first;
        if (0 < lVar9) {
          lVar7 = 1;
          do {
            piVar6[lVar7] = piVar6[lVar7 + -1];
            lVar2 = lVar9 + lVar7;
            lVar7 = lVar7 + -1;
          } while (1 < lVar2 + -1);
        }
      }
      else {
        iVar4 = *piVar6;
        piVar8 = piVar5;
        while (iVar3 < iVar4) {
          *piVar8 = iVar4;
          piVar1 = piVar8 + -2;
          piVar8 = piVar8 + -1;
          iVar4 = *piVar1;
        }
      }
      *piVar8 = iVar3;
      piVar6 = piVar6 + 1;
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }